

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

Options * __thiscall
ApprovalTests::Options::withNamer
          (Options *__return_storage_ptr__,Options *this,
          shared_ptr<ApprovalTests::ApprovalNamer> *namer)

{
  bool usingDefaultScrubber;
  pointer pcVar1;
  Reporter *reporter;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Any_data _Stack_78;
  code *local_68;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  shared_ptr<ApprovalTests::ApprovalNamer> local_30;
  
  local_58 = (undefined1  [8])(this->fileOptions_).options_;
  pcVar1 = (this->fileOptions_).fileExtensionWithDot_._M_dataplus._M_p;
  local_50._M_p = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,
             pcVar1 + (this->fileOptions_).fileExtensionWithDot_._M_string_length);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&_Stack_78,&this->scrubber_);
  reporter = this->reporter_;
  usingDefaultScrubber = this->usingDefaultScrubber_;
  local_30.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (namer->super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (namer->super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (namer->super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (namer->super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_30.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = this_00;
  Options(__return_storage_ptr__,(FileOptions *)local_58,(Scrubber *)&_Stack_78,reporter,
          usingDefaultScrubber,&local_30);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&_Stack_78,&_Stack_78,__destroy_functor);
  }
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Options Options::withNamer(std::shared_ptr<ApprovalNamer> namer)
    {
        return Options(
            fileOptions_, scrubber_, reporter_, usingDefaultScrubber_, std::move(namer));
    }